

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O0

void __thiscall
BamTools::Internal::BamStandardIndex::SaveAlignmentChunkToBin
          (BamStandardIndex *this,BaiBinMap *binMap,uint32_t *currentBin,uint64_t *currentOffset,
          uint64_t *lastOffset)

{
  bool bVar1;
  uint64_t *in_RCX;
  pair<unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>
  *in_RSI;
  uint64_t *in_R8;
  BaiAlignmentChunkVector *binChunks;
  BaiAlignmentChunkVector newChunks;
  iterator binIter;
  BaiAlignmentChunk newChunk;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  pair<unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>
  *in_stack_ffffffffffffff40;
  value_type *in_stack_ffffffffffffff48;
  vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>
  *in_stack_ffffffffffffff50;
  map<unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>_>
  *this_00;
  undefined1 local_60 [80];
  pair<unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>
  *local_10;
  
  local_10 = in_RSI;
  BaiAlignmentChunk::BaiAlignmentChunk((BaiAlignmentChunk *)(local_60 + 0x28),in_RCX,in_R8);
  local_60._32_8_ =
       std::
       map<unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>_>
       ::find((map<unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>_>
               *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),(key_type *)0x1b6f71)
  ;
  local_60._24_8_ =
       std::
       map<unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>_>
       ::end((map<unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>_>
              *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
  bVar1 = std::operator==((_Self *)(local_60 + 0x20),(_Self *)(local_60 + 0x18));
  if (bVar1) {
    this_00 = (map<unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>_>
               *)local_60;
    std::
    vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>
    ::vector((vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>
              *)0x1b6fbb);
    std::
    vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>
    ::push_back((vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>
                 *)this_00,in_stack_ffffffffffffff48);
    std::
    pair<unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>
    ::
    pair<std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_&,_true>
              (in_stack_ffffffffffffff40,
               (uint *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),
               (vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>
                *)0x1b6ff3);
    std::
    map<unsigned_int,std::vector<BamTools::Internal::BaiAlignmentChunk,std::allocator<BamTools::Internal::BaiAlignmentChunk>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<BamTools::Internal::BaiAlignmentChunk,std::allocator<BamTools::Internal::BaiAlignmentChunk>>>>>
    ::
    insert<std::pair<unsigned_int,std::vector<BamTools::Internal::BaiAlignmentChunk,std::allocator<BamTools::Internal::BaiAlignmentChunk>>>>
              (this_00,local_10);
    std::
    pair<unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>
    ::~pair((pair<unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>
             *)0x1b702b);
    std::
    vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>
    ::~vector((vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>
               *)this_00);
  }
  else {
    std::
    _Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>
    ::operator*((_Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>
                 *)0x1b7078);
    std::
    vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>
    ::push_back(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  return;
}

Assistant:

void BamStandardIndex::SaveAlignmentChunkToBin(BaiBinMap& binMap,
                                               const uint32_t& currentBin,
                                               const uint64_t& currentOffset,
                                               const uint64_t& lastOffset)
{
    // create new alignment chunk
    BaiAlignmentChunk newChunk(currentOffset, lastOffset);

    // if no entry exists yet for this bin, create one and store alignment chunk
    BaiBinMap::iterator binIter = binMap.find(currentBin);
    if ( binIter == binMap.end() ) {
        BaiAlignmentChunkVector newChunks;
        newChunks.push_back(newChunk);
        binMap.insert( pair<uint32_t, BaiAlignmentChunkVector>(currentBin, newChunks));
    }

    // otherwise, just append alignment chunk
    else {
        BaiAlignmentChunkVector& binChunks = (*binIter).second;
        binChunks.push_back( newChunk );
    }
}